

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

string_view __thiscall slang::ast::ElabSystemTaskSymbol::getMessage(ElabSystemTaskSymbol *this)

{
  SyntaxKind SVar1;
  ElabSystemTaskKind EVar2;
  ArgumentListSyntax *pAVar3;
  Scope *pSVar4;
  PropertyExprSyntax *initialExpr;
  Type *args_00;
  _Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true> *p_Var5;
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  int iVar9;
  ElabSystemTaskSyntax *pEVar10;
  ulong uVar11;
  SyntaxNode *pSVar12;
  OrderedArgumentSyntax *pOVar13;
  ExpressionSyntax *pEVar14;
  undefined4 extraout_var;
  EmptyArgumentExpression *pEVar15;
  logic_error *this_00;
  long *plVar16;
  SourceLocation *pSVar17;
  size_type *psVar18;
  Expression **ppEVar19;
  SourceLocation SVar20;
  size_t unaff_RBP;
  size_t index;
  char *unaff_R13;
  bool bVar21;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> args_01;
  LookupLocation LVar22;
  SourceRange sourceRange;
  string_view sVar23;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> argSpan;
  SmallVector<const_slang::ast::Expression_*,_5UL> args;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_188;
  Expression *local_178;
  long lStack_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  __index_type local_148;
  Compilation *local_140;
  ulong local_138;
  SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [56];
  SyntaxNode *local_d0;
  ulong local_c8;
  undefined1 local_c0 [48];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->message).
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged != true) {
    pSVar12 = (this->super_Symbol).originatingSyntax;
    if (pSVar12 == (SyntaxNode *)0x0) {
      assert::assertFailed
                ("syntax",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x22f,"string_view slang::ast::ElabSystemTaskSymbol::getMessage() const");
    }
    pEVar10 = slang::syntax::SyntaxNode::as<slang::syntax::ElabSystemTaskSyntax>(pSVar12);
    pAVar3 = pEVar10->arguments;
    if (pAVar3 != (ArgumentListSyntax *)0x0) {
      pSVar4 = (this->super_Symbol).parentScope;
      if (pSVar4 == (Scope *)0x0) {
        assert::assertFailed
                  ("scope",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                   ,0x23b,"string_view slang::ast::ElabSystemTaskSymbol::getMessage() const");
      }
      local_140 = pSVar4->compilation;
      LVar22 = LookupLocation::before(&this->super_Symbol);
      local_108._8_4_ = LVar22.index;
      local_108._16_8_ = 0;
      local_108._24_8_ = (SourceLocation)0x0;
      local_108._32_8_ = (TempVarSymbol *)0x0;
      local_108._40_8_ = (Symbol *)0x0;
      local_108._48_8_ = (AssertionInstanceDetails *)0x0;
      local_108._0_8_ = pSVar4;
      if (LVar22.scope != pSVar4 && LVar22.scope != (Scope *)0x0) {
        assert::assertFailed
                  ("!lookupLocation.getScope() || lookupLocation.getScope() == &scope",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTContext.h"
                   ,0x119,
                   "slang::ast::ASTContext::ASTContext(const Scope &, LookupLocation, bitmask<ASTFlags>)"
                  );
      }
      local_d0 = (SyntaxNode *)(local_c0 + 8);
      local_c8 = 0;
      local_c0._0_8_ = 5;
      uVar11 = (pAVar3->parameters).elements.size_ + 1;
      bVar21 = uVar11 < 2;
      if (!bVar21) {
        local_130 = &pAVar3->parameters;
        local_138 = uVar11 >> 1;
        index = 0;
        do {
          pSVar12 = &slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::operator[]
                               (local_130,index)->super_SyntaxNode;
          SVar1 = pSVar12->kind;
          if (SVar1 == EmptyArgument) {
            args_00 = local_140->voidType;
            local_168 = (undefined1  [16])slang::syntax::SyntaxNode::sourceRange(pSVar12);
            pEVar15 = BumpAllocator::
                      emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange>
                                (&local_140->super_BumpAllocator,args_00,(SourceRange *)local_168);
            local_188.data_ = (pointer)pEVar15;
            SmallVectorBase<slang::ast::Expression_const*>::
            emplace_back<slang::ast::Expression_const*>
                      ((SmallVectorBase<slang::ast::Expression_const*> *)&local_d0,
                       (Expression **)&local_188);
LAB_001c4eb4:
            if (local_c8 == 0) {
              assert::assertFailed
                        ("len",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                         ,0x62,
                         "reference slang::SmallVectorBase<const slang::ast::Expression *>::back() [T = const slang::ast::Expression *]"
                        );
            }
            bVar7 = Expression::bad(*(Expression **)((long)local_d0 + local_c8 * 8 + -8));
            bVar8 = true;
            if (bVar7) {
LAB_001c4edd:
              bVar8 = (this->message).
                      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                      ._M_engaged;
              (this->message).
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_payload._M_value._M_len = 0;
              if (bVar8 == true) {
                (this->message).
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_payload._M_value._M_str = "";
              }
              else {
                (this->message).
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_payload._M_value._M_str = "";
                (this->message).
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_engaged = true;
              }
              unaff_RBP = (this->message).
                          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                          ._M_payload._M_value._M_len;
              unaff_R13 = (this->message).
                          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                          ._M_payload._M_value._M_str;
              goto LAB_001c4f10;
            }
          }
          else {
            if (SVar1 == NamedArgument) {
              sourceRange = slang::syntax::SyntaxNode::sourceRange(pSVar12);
              ASTContext::addDiag((ASTContext *)local_108,(DiagCode)0x6a0007,sourceRange);
              goto LAB_001c4edd;
            }
            if (SVar1 != OrderedArgument) {
              this_00 = (logic_error *)__cxa_allocate_exception(0x10);
              local_90[0] = local_80;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_90,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                         ,"");
              plVar16 = (long *)std::__cxx11::string::append((char *)local_90);
              local_128._M_dataplus._M_p = (pointer)*plVar16;
              psVar18 = (size_type *)(plVar16 + 2);
              if ((size_type *)local_128._M_dataplus._M_p == psVar18) {
                local_128.field_2._M_allocated_capacity = *psVar18;
                local_128.field_2._8_8_ = plVar16[3];
                local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              }
              else {
                local_128.field_2._M_allocated_capacity = *psVar18;
              }
              local_128._M_string_length = plVar16[1];
              *plVar16 = (long)psVar18;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              std::__cxx11::to_string(&local_70,0x253);
              std::operator+(&local_50,&local_128,&local_70);
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_50);
              local_188.data_ = (pointer)*plVar16;
              ppEVar19 = (Expression **)(plVar16 + 2);
              if (local_188.data_ == ppEVar19) {
                local_178 = *ppEVar19;
                lStack_170 = plVar16[3];
                local_188.data_ = &local_178;
              }
              else {
                local_178 = *ppEVar19;
              }
              local_188.size_ = plVar16[1];
              *plVar16 = (long)ppEVar19;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              pSVar17 = (SourceLocation *)std::__cxx11::string::append((char *)&local_188);
              local_168._0_8_ = *pSVar17;
              SVar20 = (SourceLocation)(pSVar17 + 2);
              if ((SourceLocation)local_168._0_8_ == SVar20) {
                local_158._0_8_ = *(undefined8 *)SVar20;
                local_158._8_8_ = pSVar17[3];
                local_168._0_8_ = local_158;
              }
              else {
                local_158._0_8_ = *(undefined8 *)SVar20;
              }
              local_168._8_8_ = pSVar17[1];
              *pSVar17 = SVar20;
              pSVar17[1] = (SourceLocation)0x0;
              *(undefined1 *)(pSVar17 + 2) = 0;
              std::logic_error::logic_error(this_00,(string *)local_168);
              __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            pOVar13 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedArgumentSyntax>(pSVar12);
            initialExpr = (pOVar13->expr).ptr;
            if (initialExpr == (PropertyExprSyntax *)0x0) {
              assert::assertFailed
                        ("ptr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                         ,0x26,
                         "T slang::not_null<slang::syntax::PropertyExprSyntax *>::get() const [T = slang::syntax::PropertyExprSyntax *]"
                        );
            }
            pEVar14 = ASTContext::requireSimpleExpr((ASTContext *)local_108,initialExpr);
            if (pEVar14 == (ExpressionSyntax *)0x0) {
              bVar8 = (this->message).
                      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                      ._M_engaged;
              (this->message).
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_payload._M_value._M_len = 0;
              if (bVar8 == true) {
                (this->message).
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_payload._M_value._M_str = "";
              }
              else {
                (this->message).
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_payload._M_value._M_str = "";
                (this->message).
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_engaged = true;
              }
              unaff_RBP = (this->message).
                          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                          ._M_payload._M_value._M_len;
              unaff_R13 = (this->message).
                          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                          ._M_payload._M_value._M_str;
            }
            else {
              iVar9 = Expression::bind((int)pEVar14,(sockaddr *)local_108,0);
              auVar6 = local_168;
              local_168._4_4_ = extraout_var;
              local_168._0_4_ = iVar9;
              local_168._8_8_ = auVar6._8_8_;
              SmallVectorBase<slang::ast::Expression_const*>::
              emplace_back<slang::ast::Expression_const*>
                        ((SmallVectorBase<slang::ast::Expression_const*> *)&local_d0,
                         (Expression **)local_168);
            }
            if (pEVar14 != (ExpressionSyntax *)0x0) goto LAB_001c4eb4;
LAB_001c4f10:
            bVar8 = false;
          }
          if (!bVar8) break;
          index = index + 1;
          bVar21 = local_138 == index;
        } while (!bVar21);
      }
      if (bVar21) {
        local_188.size_ = local_c8;
        local_188.data_ = (pointer)local_d0;
        uVar11 = local_c8;
        if (local_c8 == 0) {
LAB_001c503a:
          args_01.size_ = uVar11;
          args_01.data_ = (pointer)local_188.size_;
          sVar23 = createMessage((ElabSystemTaskSymbol *)local_108,(ASTContext *)local_188.data_,
                                 args_01);
          p_Var5 = &(this->message).
                    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
          ;
          *(size_t *)
           &(p_Var5->_M_payload).
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload = sVar23._M_len;
          *(char **)((long)&(p_Var5->_M_payload).
                            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                            ._M_payload + 8) = sVar23._M_str;
        }
        else {
          EVar2 = this->taskKind;
          uVar11 = (ulong)EVar2;
          if (EVar2 != StaticAssert) {
            if (EVar2 == Fatal) {
              bVar21 = FmtHelpers::checkFinishNum
                                 ((ASTContext *)local_108,(Expression *)local_d0->parent);
              if (!bVar21) goto LAB_001c4ff2;
              local_188 = nonstd::span_lite::
                          span<const_slang::ast::Expression_*const,_18446744073709551615UL>::subspan
                                    (&local_188,1,0xffffffffffffffff);
            }
            goto LAB_001c503a;
          }
          bVar8 = ASTContext::requireBooleanConvertible
                            ((ASTContext *)local_108,(Expression *)local_d0->parent);
          bVar21 = true;
          if (bVar8) {
            if (local_188.size_ == 0) goto LAB_001c5230;
            uVar11 = 0;
            ASTContext::eval((ConstantValue *)local_168,(ASTContext *)local_108,*local_188.data_,
                             (bitmask<slang::ast::EvalFlags>)0x0);
            bVar21 = local_148 == '\0';
          }
          if (bVar8) {
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)local_168);
          }
          if (!bVar21) {
            if (local_188.size_ == 0) {
LAB_001c5230:
              std::terminate();
            }
            this->assertCondition = *local_188.data_;
            local_188 = nonstd::span_lite::
                        span<const_slang::ast::Expression_*const,_18446744073709551615UL>::subspan
                                  (&local_188,1,0xffffffffffffffff);
            goto LAB_001c503a;
          }
LAB_001c4ff2:
          (this->message).
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_payload._M_value._M_len = 0;
          (this->message).
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_payload._M_value._M_str = "";
        }
        if ((this->message).
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_engaged == false) {
          (this->message).
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_engaged = true;
        }
        unaff_RBP = (this->message).
                    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                    ._M_payload._M_value._M_len;
        unaff_R13 = (this->message).
                    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                    ._M_payload._M_value._M_str;
      }
      if (local_d0 != (SyntaxNode *)(local_c0 + 8)) {
        free(local_d0);
      }
      goto LAB_001c5084;
    }
    (this->message).
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_len = 0;
    (this->message).
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_str = "";
    if ((this->message).
        super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_engaged == false) {
      (this->message).
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged = true;
    }
  }
  unaff_RBP = (this->message).
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_payload._M_value._M_len;
  unaff_R13 = (this->message).
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_payload._M_value._M_str;
LAB_001c5084:
  sVar23._M_str = unaff_R13;
  sVar23._M_len = unaff_RBP;
  return sVar23;
}

Assistant:

string_view ElabSystemTaskSymbol::getMessage() const {
    if (message)
        return *message;

    auto syntax = getSyntax();
    ASSERT(syntax);

    auto empty = [&] {
        message = ""sv;
        return *message;
    };

    auto argSyntax = syntax->as<ElabSystemTaskSyntax>().arguments;
    if (!argSyntax)
        return empty();

    auto scope = getParentScope();
    ASSERT(scope);

    // Bind all arguments.
    auto& comp = scope->getCompilation();
    ASTContext astCtx(*scope, LookupLocation::before(*this));
    SmallVector<const Expression*> args;
    for (auto arg : argSyntax->parameters) {
        switch (arg->kind) {
            case SyntaxKind::OrderedArgument: {
                const auto& oa = arg->as<OrderedArgumentSyntax>();
                if (auto exSyn = astCtx.requireSimpleExpr(*oa.expr))
                    args.push_back(&Expression::bind(*exSyn, astCtx));
                else
                    return empty();
                break;
            }
            case SyntaxKind::NamedArgument:
                astCtx.addDiag(diag::NamedArgNotAllowed, arg->sourceRange());
                return empty();
            case SyntaxKind::EmptyArgument:
                args.push_back(
                    comp.emplace<EmptyArgumentExpression>(comp.getVoidType(), arg->sourceRange()));
                break;
            default:
                ASSUME_UNREACHABLE;
        }

        if (args.back()->bad())
            return empty();
    }

    span<const Expression* const> argSpan = args;
    if (!argSpan.empty()) {
        if (taskKind == ElabSystemTaskKind::Fatal) {
            // If this is a $fatal task, check the finish number. We don't use this
            // for anything, but enforce that it's 0, 1, or 2.
            if (!FmtHelpers::checkFinishNum(astCtx, *argSpan[0]))
                return empty();

            argSpan = argSpan.subspan(1);
        }
        else if (taskKind == ElabSystemTaskKind::StaticAssert) {
            // The first argument is the condition to check.
            if (!astCtx.requireBooleanConvertible(*argSpan[0]) || !astCtx.eval(*argSpan[0]))
                return empty();

            assertCondition = argSpan[0];
            argSpan = argSpan.subspan(1);
        }
    }

    message = createMessage(astCtx, argSpan);
    return *message;
}